

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcBuilding::IfcBuilding(IfcBuilding *this)

{
  *(undefined ***)&this->field_0x198 = &PTR__Object_007331c0;
  *(undefined8 *)&this->field_0x1a0 = 0;
  *(char **)&this->field_0x1a8 = "IfcBuilding";
  IfcSpatialStructureElement::IfcSpatialStructureElement
            (&this->super_IfcSpatialStructureElement,&PTR_construction_vtable_24__00779610);
  *(undefined8 *)&(this->super_IfcSpatialStructureElement).field_0x160 = 0;
  *(undefined8 *)&(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject =
       0x779508;
  *(undefined8 *)&this->field_0x198 = 0x7795f8;
  *(undefined8 *)
   &(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.field_0x88 = 0x779530;
  (this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x779558;
  *(undefined8 *)
   &(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.field_0xd0 = 0x779580;
  *(undefined8 *)&(this->super_IfcSpatialStructureElement).super_IfcProduct.field_0x100 = 0x7795a8;
  *(undefined8 *)&(this->super_IfcSpatialStructureElement).field_0x158 = 0x7795d0;
  this->field_0x170 = 0;
  (this->ElevationOfTerrain).have = false;
  (this->BuildingAddress).ptr.obj = (LazyObject *)0x0;
  (this->BuildingAddress).have = false;
  return;
}

Assistant:

IfcBuilding() : Object("IfcBuilding") {}